

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NetworkUpdateParameters::MergeFrom
          (NetworkUpdateParameters *this,NetworkUpdateParameters *from)

{
  void *pvVar1;
  LogMessage *other;
  Optimizer *pOVar2;
  Int64Parameter *pIVar3;
  BoolParameter *pBVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x11c4b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
            (&(this->losslayers_).super_RepeatedPtrFieldBase,
             &(from->losslayers_).super_RepeatedPtrFieldBase);
  if ((from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) &&
     (from->optimizer_ != (Optimizer *)0x0)) {
    if (this->optimizer_ == (Optimizer *)0x0) {
      pOVar2 = (Optimizer *)operator_new(0x20);
      Optimizer::Optimizer(pOVar2);
      this->optimizer_ = pOVar2;
    }
    pOVar2 = from->optimizer_;
    if (pOVar2 == (Optimizer *)0x0) {
      pOVar2 = (Optimizer *)&_Optimizer_default_instance_;
    }
    Optimizer::MergeFrom(this->optimizer_,pOVar2);
  }
  if ((from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) &&
     (from->epochs_ != (Int64Parameter *)0x0)) {
    if (this->epochs_ == (Int64Parameter *)0x0) {
      pIVar3 = (Int64Parameter *)operator_new(0x28);
      Int64Parameter::Int64Parameter(pIVar3);
      this->epochs_ = pIVar3;
    }
    pIVar3 = from->epochs_;
    if (pIVar3 == (Int64Parameter *)0x0) {
      pIVar3 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(this->epochs_,pIVar3);
  }
  if ((from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) &&
     (from->shuffle_ != (BoolParameter *)0x0)) {
    if (this->shuffle_ == (BoolParameter *)0x0) {
      pBVar4 = (BoolParameter *)operator_new(0x18);
      BoolParameter::BoolParameter(pBVar4);
      this->shuffle_ = pBVar4;
    }
    pBVar4 = from->shuffle_;
    if (pBVar4 == (BoolParameter *)0x0) {
      pBVar4 = (BoolParameter *)&_BoolParameter_default_instance_;
    }
    BoolParameter::MergeFrom(this->shuffle_,pBVar4);
  }
  if ((from != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) &&
     (from->seed_ != (Int64Parameter *)0x0)) {
    if (this->seed_ == (Int64Parameter *)0x0) {
      pIVar3 = (Int64Parameter *)operator_new(0x28);
      Int64Parameter::Int64Parameter(pIVar3);
      this->seed_ = pIVar3;
    }
    pIVar3 = from->seed_;
    if (pIVar3 == (Int64Parameter *)0x0) {
      pIVar3 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(this->seed_,pIVar3);
  }
  return;
}

Assistant:

void NetworkUpdateParameters::MergeFrom(const NetworkUpdateParameters& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NetworkUpdateParameters)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  losslayers_.MergeFrom(from.losslayers_);
  if (from.has_optimizer()) {
    mutable_optimizer()->::CoreML::Specification::Optimizer::MergeFrom(from.optimizer());
  }
  if (from.has_epochs()) {
    mutable_epochs()->::CoreML::Specification::Int64Parameter::MergeFrom(from.epochs());
  }
  if (from.has_shuffle()) {
    mutable_shuffle()->::CoreML::Specification::BoolParameter::MergeFrom(from.shuffle());
  }
  if (from.has_seed()) {
    mutable_seed()->::CoreML::Specification::Int64Parameter::MergeFrom(from.seed());
  }
}